

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

void free_tables(ip_tables_t *ipts)

{
  int local_14;
  int i;
  ip_tables_t *ipts_local;
  
  if (ipts != (ip_tables_t *)0x0) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      free_table(ipts->tables[local_14]);
      ipts->tables[local_14] = (ip_table_t *)0x0;
    }
    if (ipts != (ip_tables_t *)0x0) {
      mwFree(ipts,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
             0x89);
    }
  }
  return;
}

Assistant:

void free_tables(ip_tables_t *ipts)
{
	if (ipts == NULL) {
		return;
	}

	for (int i = 0; i < TABLE_MAX; i++) {
		free_table(ipts->tables[i]);
		ipts->tables[i] = NULL;
	}

	_free(ipts);
}